

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

SweepResolutionFormulas __thiscall ON_Displacement::SweepResolutionFormula(ON_Displacement *this)

{
  ON_InternalXMLImpl *this_00;
  SweepResolutionFormulas SVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  this_00 = &((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,0);
  ON_InternalXMLImpl::GetParameter(&local_200,this_00,L"",L"sweep-res-formula",&local_108);
  SVar1 = ::ON_XMLVariant::AsInteger(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return SVar1;
}

Assistant:

ON_Displacement::SweepResolutionFormulas ON_Displacement::SweepResolutionFormula(void) const
{
  const auto def = SweepResolutionFormulas::Default;
  const int v = m_impl->GetParameter(ON_DISPLACEMENT_SWEEP_RES_FORMULA, int(def)).AsInteger();
  return SweepResolutionFormulas(v);
}